

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::stringOps::trim_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view whitespace)

{
  size_type __pos;
  size_type sVar1;
  allocator<char> local_49;
  string_view input_local;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  input_local._M_str = (char *)input._M_len;
  input_local._M_len = (size_t)this;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (&input_local,(char *)whitespace._M_len,0,(size_type)input._M_str);
  if (__pos == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&input_local,(char *)whitespace._M_len,0xffffffffffffffff,
                       (size_type)input._M_str);
    local_38 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,__pos,
                          (sVar1 - __pos) + 1);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_38,&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string_view input, std::string_view whitespace)
    {
        const auto strStart = input.find_first_not_of(whitespace);
        if (strStart == std::string::npos) {
            return {};  // no content
        }

        const auto strEnd = input.find_last_not_of(whitespace);

        return std::string{input.substr(strStart, strEnd - strStart + 1)};
    }